

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileProcess.h
# Opt level: O0

bool __thiscall FileReader::findNext(FileReader *this,char *fileName)

{
  int iVar1;
  dirent *pdVar2;
  char *fileName_local;
  FileReader *this_local;
  
  pdVar2 = readdir((DIR *)this->dir);
  this->ptr = (dirent *)pdVar2;
  if (pdVar2 == (dirent *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = strcmp(this->ptr->d_name,".");
    if ((iVar1 == 0) || (iVar1 = strcmp(this->ptr->d_name,".."), iVar1 == 0)) {
      pdVar2 = readdir((DIR *)this->dir);
      this->ptr = (dirent *)pdVar2;
      if (pdVar2 == (dirent *)0x0) {
        return false;
      }
    }
    if ((this->ptr->d_type == '\b') || (this->ptr->d_type == '\n')) {
      memset(fileName,0,8);
      strcpy(fileName,this->ptr->d_name);
    }
    else if (this->ptr->d_type == '\x04') {
      printf("Base File Directory including sub-directory\n");
      return false;
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FileReader::findNext(char* fileName)
{
    if((ptr=readdir(dir)) != NULL)
    {
        if(strcmp(ptr->d_name,".")==0 || strcmp(ptr->d_name,"..")==0)    ///current dir OR parrent dir
        {
            /*even for reading the same directory,sometimes d_name may be . or .., just ignore it then it can work well*/
            //printf("File Reader end by . or ..");
            if((ptr=readdir(dir)) == NULL)return false;
        }
        if(ptr->d_type == 8 || ptr->d_type == 10)    ///file or link file
        {
            //printf("In FileReader: %s\n",ptr->d_name);
            memset(fileName,'\0',sizeof(fileName));
            strcpy(fileName,ptr->d_name);
        }
        else if(ptr->d_type == 4)    ///dir
        {
            printf("Base File Directory including sub-directory\n");
            //if((ptr=readdir(dir)) == NULL)return false;
            return false;
        }
        return true;
    }
    return false;
}